

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareEqualMultiplierSimple_Test::~Units_compareEqualMultiplierSimple_Test
          (Units_compareEqualMultiplierSimple_Test *this)

{
  Units_compareEqualMultiplierSimple_Test *this_local;
  
  ~Units_compareEqualMultiplierSimple_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareEqualMultiplierSimple)
{
    // u1 = 1000*u2
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", 0, 1.0, 113.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("metre", 0, 1.0, 113.0);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
}